

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O0

void * ngx_slab_alloc_locked(ngx_slab_pool_t *pool,size_t size)

{
  ulong *puVar1;
  u_char *puVar2;
  ngx_slab_page_t *pnVar3;
  ngx_slab_page_t *pnVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  ngx_slab_page_t *slots;
  ngx_slab_page_t *prev;
  ngx_slab_page_t *page;
  ngx_uint_t map;
  ngx_uint_t shift;
  ngx_uint_t slot;
  ngx_uint_t i;
  uintptr_t *bitmap;
  uintptr_t mask;
  uintptr_t m;
  uintptr_t n;
  uintptr_t p;
  size_t s;
  size_t size_local;
  ngx_slab_pool_t *pool_local;
  
  if (ngx_slab_max_size < size) {
    if ((ngx_cycle->log->log_level & 0x20) != 0) {
      ngx_log_error_core(8,ngx_cycle->log,0,"slab alloc: %uz",size);
    }
    pnVar4 = ngx_slab_alloc_pages
                       (pool,(size >> ((byte)ngx_pagesize_shift & 0x3f)) +
                             (long)(int)(uint)(size % ngx_pagesize != 0));
    if (pnVar4 == (ngx_slab_page_t *)0x0) {
      n = 0;
    }
    else {
      n = (uintptr_t)
          (pool->start +
          (((long)pnVar4 - (long)pool->pages) / 0x18 << ((byte)ngx_pagesize_shift & 0x3f)));
    }
  }
  else {
    if (pool->min_size < size) {
      map = 1;
      p = size - 1;
      while (p = p >> 1, p != 0) {
        map = map + 1;
      }
      shift = map - pool->min_shift;
    }
    else {
      map = pool->min_shift;
      shift = 0;
    }
    pool->stats[shift].reqs = pool->stats[shift].reqs + 1;
    if ((ngx_cycle->log->log_level & 0x20) != 0) {
      ngx_log_error_core(8,ngx_cycle->log,0,"slab alloc: %uz slot: %ui",size,shift);
    }
    puVar1 = (ulong *)(&pool[1].min_size)[shift * 3];
    bVar7 = (byte)map;
    if ((ulong *)puVar1[1] != puVar1) {
      if (map < ngx_slab_exact_shift) {
        lVar5 = ((long)puVar1 - (long)pool->pages) / 0x18 << ((byte)ngx_pagesize_shift & 0x3f);
        puVar2 = pool->start;
        uVar6 = (ngx_pagesize >> (bVar7 & 0x3f)) >> 6;
        for (m = 0; m < uVar6; m = m + 1) {
          if (*(long *)(puVar2 + m * 8 + lVar5) != -1) {
            slot = 0;
            for (mask = 1; mask != 0; mask = mask << 1) {
              if ((*(ulong *)(puVar2 + m * 8 + lVar5) & mask) == 0) {
                *(uintptr_t *)(puVar2 + m * 8 + lVar5) = mask | *(ulong *)(puVar2 + m * 8 + lVar5);
                n = (uintptr_t)(puVar2 + (m * 0x40 + slot << (bVar7 & 0x3f)) + lVar5);
                pool->stats[shift].used = pool->stats[shift].used + 1;
                if (*(long *)(puVar2 + m * 8 + lVar5) != -1) goto LAB_0012a49d;
                goto LAB_00129d7b;
              }
              slot = slot + 1;
            }
          }
        }
      }
      else if (map == ngx_slab_exact_shift) {
        slot = 0;
        for (mask = 1; mask != 0; mask = mask << 1) {
          if ((*puVar1 & mask) == 0) {
            *puVar1 = mask | *puVar1;
            if (*puVar1 == 0xffffffffffffffff) {
              *(ulong *)((puVar1[2] & 0xfffffffffffffffc) + 8) = puVar1[1];
              *(ulong *)(puVar1[1] + 0x10) = puVar1[2];
              puVar1[1] = 0;
              puVar1[2] = 2;
            }
            n = (uintptr_t)
                (pool->start +
                (slot << (bVar7 & 0x3f)) +
                (((long)puVar1 - (long)pool->pages) / 0x18 << ((byte)ngx_pagesize_shift & 0x3f)));
            pool->stats[shift].used = pool->stats[shift].used + 1;
            goto LAB_0012a49d;
          }
          slot = slot + 1;
        }
      }
      else {
        uVar6 = (1L << ((byte)(ngx_pagesize >> (bVar7 & 0x3f)) & 0x3f)) + -1 << 0x20;
        slot = 0;
        for (mask = 0x100000000; (mask & uVar6) != 0; mask = mask << 1) {
          if ((*puVar1 & mask) == 0) {
            *puVar1 = mask | *puVar1;
            if ((*puVar1 & 0xffffffff00000000) == uVar6) {
              *(ulong *)((puVar1[2] & 0xfffffffffffffffc) + 8) = puVar1[1];
              *(ulong *)(puVar1[1] + 0x10) = puVar1[2];
              puVar1[1] = 0;
              puVar1[2] = 1;
            }
            n = (uintptr_t)
                (pool->start +
                (slot << (bVar7 & 0x3f)) +
                (((long)puVar1 - (long)pool->pages) / 0x18 << ((byte)ngx_pagesize_shift & 0x3f)));
            pool->stats[shift].used = pool->stats[shift].used + 1;
            goto LAB_0012a49d;
          }
          slot = slot + 1;
        }
      }
      ngx_slab_error(pool,2,"ngx_slab_alloc(): page is busy");
      ngx_debug_point();
    }
    pnVar4 = ngx_slab_alloc_pages(pool,1);
    if (pnVar4 == (ngx_slab_page_t *)0x0) {
      n = 0;
      pool->stats[shift].fails = pool->stats[shift].fails + 1;
    }
    else if (map < ngx_slab_exact_shift) {
      pnVar3 = pool->pages;
      bVar8 = (byte)ngx_pagesize_shift;
      puVar2 = pool->start;
      m = (ngx_pagesize >> (bVar7 & 0x3f)) / (ulong)(long)((1 << (bVar7 & 0x1f)) << 3);
      if (m == 0) {
        m = 1;
      }
      *(long *)(puVar2 + (((long)pnVar4 - (long)pnVar3) / 0x18 << (bVar8 & 0x3f))) =
           (2L << ((byte)m & 0x3f)) + -1;
      uVar6 = ngx_pagesize >> (bVar7 & 0x3f);
      for (slot = 1; slot < uVar6 >> 6; slot = slot + 1) {
        *(long *)((long)(puVar2 + (((long)pnVar4 - (long)pnVar3) / 0x18 << (bVar8 & 0x3f))) +
                 slot * 8) = 0;
      }
      pnVar4->slab = map;
      pnVar4->next = (ngx_slab_page_t *)(&pool[1].lock + shift * 3);
      pnVar4->prev = (ulong)(&pool[1].lock + shift * 3) | 3;
      (&pool[1].min_size)[shift * 3] = (size_t)pnVar4;
      pool->stats[shift].total = ((ngx_pagesize >> (bVar7 & 0x3f)) - m) + pool->stats[shift].total;
      n = (uintptr_t)
          (pool->start +
          (m << (bVar7 & 0x3f)) +
          (((long)pnVar4 - (long)pool->pages) / 0x18 << ((byte)ngx_pagesize_shift & 0x3f)));
      pool->stats[shift].used = pool->stats[shift].used + 1;
    }
    else if (map == ngx_slab_exact_shift) {
      pnVar4->slab = 1;
      pnVar4->next = (ngx_slab_page_t *)(&pool[1].lock + shift * 3);
      pnVar4->prev = (ulong)(&pool[1].lock + shift * 3) | 2;
      (&pool[1].min_size)[shift * 3] = (size_t)pnVar4;
      pool->stats[shift].total = pool->stats[shift].total + 0x40;
      n = (uintptr_t)
          (pool->start +
          (((long)pnVar4 - (long)pool->pages) / 0x18 << ((byte)ngx_pagesize_shift & 0x3f)));
      pool->stats[shift].used = pool->stats[shift].used + 1;
    }
    else {
      pnVar4->slab = map | 0x100000000;
      pnVar4->next = (ngx_slab_page_t *)(&pool[1].lock + shift * 3);
      pnVar4->prev = (ulong)(&pool[1].lock + shift * 3) | 1;
      (&pool[1].min_size)[shift * 3] = (size_t)pnVar4;
      pool->stats[shift].total = (ngx_pagesize >> (bVar7 & 0x3f)) + pool->stats[shift].total;
      n = (uintptr_t)
          (pool->start +
          (((long)pnVar4 - (long)pool->pages) / 0x18 << ((byte)ngx_pagesize_shift & 0x3f)));
      pool->stats[shift].used = pool->stats[shift].used + 1;
    }
  }
  goto LAB_0012a49d;
  while (*(long *)(puVar2 + m * 8 + lVar5) == -1) {
LAB_00129d7b:
    m = m + 1;
    if (uVar6 <= m) {
      *(ulong *)((puVar1[2] & 0xfffffffffffffffc) + 8) = puVar1[1];
      *(ulong *)(puVar1[1] + 0x10) = puVar1[2];
      puVar1[1] = 0;
      puVar1[2] = 3;
      break;
    }
  }
LAB_0012a49d:
  if ((ngx_cycle->log->log_level & 0x20) != 0) {
    ngx_log_error_core(8,ngx_cycle->log,0,"slab alloc: %p",n);
  }
  return (void *)n;
}

Assistant:

void *
ngx_slab_alloc_locked(ngx_slab_pool_t *pool, size_t size)
{
    size_t            s;
    uintptr_t         p, n, m, mask, *bitmap;
    ngx_uint_t        i, slot, shift, map;
    ngx_slab_page_t  *page, *prev, *slots;

    if (size > ngx_slab_max_size) {

        ngx_log_debug1(NGX_LOG_DEBUG_ALLOC, ngx_cycle->log, 0,
                       "slab alloc: %uz", size);

        page = ngx_slab_alloc_pages(pool, (size >> ngx_pagesize_shift)
                                          + ((size % ngx_pagesize) ? 1 : 0));
        if (page) {
            p = ngx_slab_page_addr(pool, page);

        } else {
            p = 0;
        }

        goto done;
    }

    if (size > pool->min_size) {
        shift = 1;
        for (s = size - 1; s >>= 1; shift++) { /* void */ }
        slot = shift - pool->min_shift;

    } else {
        shift = pool->min_shift;
        slot = 0;
    }

    pool->stats[slot].reqs++;

    ngx_log_debug2(NGX_LOG_DEBUG_ALLOC, ngx_cycle->log, 0,
                   "slab alloc: %uz slot: %ui", size, slot);

    slots = ngx_slab_slots(pool);
    page = slots[slot].next;

    if (page->next != page) {

        if (shift < ngx_slab_exact_shift) {

            bitmap = (uintptr_t *) ngx_slab_page_addr(pool, page);

            map = (ngx_pagesize >> shift) / (sizeof(uintptr_t) * 8);

            for (n = 0; n < map; n++) {

                if (bitmap[n] != NGX_SLAB_BUSY) {

                    for (m = 1, i = 0; m; m <<= 1, i++) {
                        if (bitmap[n] & m) {
                            continue;
                        }

                        bitmap[n] |= m;

                        i = (n * sizeof(uintptr_t) * 8 + i) << shift;

                        p = (uintptr_t) bitmap + i;

                        pool->stats[slot].used++;

                        if (bitmap[n] == NGX_SLAB_BUSY) {
                            for (n = n + 1; n < map; n++) {
                                if (bitmap[n] != NGX_SLAB_BUSY) {
                                    goto done;
                                }
                            }

                            prev = ngx_slab_page_prev(page);
                            prev->next = page->next;
                            page->next->prev = page->prev;

                            page->next = NULL;
                            page->prev = NGX_SLAB_SMALL;
                        }

                        goto done;
                    }
                }
            }

        } else if (shift == ngx_slab_exact_shift) {

            for (m = 1, i = 0; m; m <<= 1, i++) {
                if (page->slab & m) {
                    continue;
                }

                page->slab |= m;

                if (page->slab == NGX_SLAB_BUSY) {
                    prev = ngx_slab_page_prev(page);
                    prev->next = page->next;
                    page->next->prev = page->prev;

                    page->next = NULL;
                    page->prev = NGX_SLAB_EXACT;
                }

                p = ngx_slab_page_addr(pool, page) + (i << shift);

                pool->stats[slot].used++;

                goto done;
            }

        } else { /* shift > ngx_slab_exact_shift */

            mask = ((uintptr_t) 1 << (ngx_pagesize >> shift)) - 1;
            mask <<= NGX_SLAB_MAP_SHIFT;

            for (m = (uintptr_t) 1 << NGX_SLAB_MAP_SHIFT, i = 0;
                 m & mask;
                 m <<= 1, i++)
            {
                if (page->slab & m) {
                    continue;
                }

                page->slab |= m;

                if ((page->slab & NGX_SLAB_MAP_MASK) == mask) {
                    prev = ngx_slab_page_prev(page);
                    prev->next = page->next;
                    page->next->prev = page->prev;

                    page->next = NULL;
                    page->prev = NGX_SLAB_BIG;
                }

                p = ngx_slab_page_addr(pool, page) + (i << shift);

                pool->stats[slot].used++;

                goto done;
            }
        }

        ngx_slab_error(pool, NGX_LOG_ALERT, "ngx_slab_alloc(): page is busy");
        ngx_debug_point();
    }

    page = ngx_slab_alloc_pages(pool, 1);

    if (page) {
        if (shift < ngx_slab_exact_shift) {
            bitmap = (uintptr_t *) ngx_slab_page_addr(pool, page);

            n = (ngx_pagesize >> shift) / ((1 << shift) * 8);

            if (n == 0) {
                n = 1;
            }

            /* "n" elements for bitmap, plus one requested */
            bitmap[0] = ((uintptr_t) 2 << n) - 1;

            map = (ngx_pagesize >> shift) / (sizeof(uintptr_t) * 8);

            for (i = 1; i < map; i++) {
                bitmap[i] = 0;
            }

            page->slab = shift;
            page->next = &slots[slot];
            page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_SMALL;

            slots[slot].next = page;

            pool->stats[slot].total += (ngx_pagesize >> shift) - n;

            p = ngx_slab_page_addr(pool, page) + (n << shift);

            pool->stats[slot].used++;

            goto done;

        } else if (shift == ngx_slab_exact_shift) {

            page->slab = 1;
            page->next = &slots[slot];
            page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_EXACT;

            slots[slot].next = page;

            pool->stats[slot].total += sizeof(uintptr_t) * 8;

            p = ngx_slab_page_addr(pool, page);

            pool->stats[slot].used++;

            goto done;

        } else { /* shift > ngx_slab_exact_shift */

            page->slab = ((uintptr_t) 1 << NGX_SLAB_MAP_SHIFT) | shift;
            page->next = &slots[slot];
            page->prev = (uintptr_t) &slots[slot] | NGX_SLAB_BIG;

            slots[slot].next = page;

            pool->stats[slot].total += ngx_pagesize >> shift;

            p = ngx_slab_page_addr(pool, page);

            pool->stats[slot].used++;

            goto done;
        }
    }

    p = 0;

    pool->stats[slot].fails++;

done:

    ngx_log_debug1(NGX_LOG_DEBUG_ALLOC, ngx_cycle->log, 0,
                   "slab alloc: %p", (void *) p);

    return (void *) p;
}